

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

ChConstraintThreeBBShaft * __thiscall
chrono::ChConstraintThreeBBShaft::operator=
          (ChConstraintThreeBBShaft *this,ChConstraintThreeBBShaft *other)

{
  ChVariables *pCVar1;
  
  if (other != this) {
    ChConstraintThree::operator=(&this->super_ChConstraintThree,&other->super_ChConstraintThree);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,6,1,1,6>,Eigen::Matrix<double,1,6,1,1,6>>
              (&this->Cq_a,&other->Cq_a);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,1,6,1,1,6>,Eigen::Matrix<double,1,6,1,1,6>>
              (&this->Cq_b,&other->Cq_b);
    (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.m_data.array
    [0] = (other->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.
          m_data.array[0];
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              (&this->Eq_a,&other->Eq_a);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              (&this->Eq_b,&other->Eq_b);
    (this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
    [0] = (other->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0];
    pCVar1 = (other->super_ChConstraintThree).variables_b;
    (this->super_ChConstraintThree).variables_a = (other->super_ChConstraintThree).variables_a;
    (this->super_ChConstraintThree).variables_b = pCVar1;
    (this->super_ChConstraintThree).variables_c = (other->super_ChConstraintThree).variables_c;
  }
  return this;
}

Assistant:

ChConstraintThreeBBShaft& ChConstraintThreeBBShaft::operator=(const ChConstraintThreeBBShaft& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraintThree::operator=(other);

    Cq_a = other.Cq_a;
    Cq_b = other.Cq_b;
    Cq_c = other.Cq_c;
    Eq_a = other.Eq_a;
    Eq_b = other.Eq_b;
    Eq_c = other.Eq_c;

    this->variables_a = other.variables_a;
    this->variables_b = other.variables_b;
    this->variables_c = other.variables_c;

    return *this;
}